

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::DataSourceDescriptor(DataSourceDescriptor *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__DataSourceDescriptor_003c6c18;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->id_ = 0;
  *(undefined4 *)((long)&this->id_ + 7) = 0;
  (this->gpu_counter_descriptor_)._M_dataplus._M_p =
       (pointer)&(this->gpu_counter_descriptor_).field_2;
  (this->gpu_counter_descriptor_)._M_string_length = 0;
  (this->gpu_counter_descriptor_).field_2._M_local_buf[0] = '\0';
  (this->track_event_descriptor_)._M_dataplus._M_p =
       (pointer)&(this->track_event_descriptor_).field_2;
  (this->track_event_descriptor_)._M_string_length = 0;
  (this->track_event_descriptor_).field_2._M_local_buf[0] = '\0';
  (this->ftrace_descriptor_)._M_dataplus._M_p = (pointer)&(this->ftrace_descriptor_).field_2;
  (this->ftrace_descriptor_)._M_string_length = 0;
  (this->ftrace_descriptor_).field_2._M_local_buf[0] = '\0';
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

DataSourceDescriptor::DataSourceDescriptor() = default;